

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O1

obj * floorfood(char *verb)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  boolean bVar9;
  char cVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  code *pcVar14;
  trap *trap;
  char *pcVar15;
  char *pcVar16;
  you *unaff_R13;
  _func_boolean_obj_ptr *allow;
  bool bVar17;
  object_pick *floorfood_list;
  char qbuf [128];
  char qbuf_1 [128];
  obj *local_148;
  object_pick *local_140;
  char local_138 [128];
  char local_b8 [136];
  
  iVar11 = strcmp(verb,"eat");
  iVar12 = strcmp(verb,"sacrifice");
  iVar13 = strcmp(verb,"tin");
  if ((verb == (char *)0x0) || (*verb == '\0')) {
    impossible("floorfood: no verb given");
  }
  if (iVar11 == 0) {
    pcVar14 = is_edible;
  }
  else {
    pcVar14 = other_floorfood;
  }
  if (iVar13 == 0) {
    pcVar14 = tinnable;
  }
  allow = can_sacrifice;
  if (iVar12 != 0) {
    allow = pcVar14;
  }
  bVar9 = can_reach_floor();
  bVar2 = true;
  if ((bVar9 == '\0') || ((unaff_R13 = &u, iVar11 == 0 && (u.usteed != (monst *)0x0)))) {
LAB_0018ff08:
    bVar7 = false;
    bVar5 = false;
    goto LAB_0019013e;
  }
  bVar9 = is_pool(level,(int)u.ux,(int)u.uy);
  if ((bVar9 == '\0') && (bVar9 = is_lava(level,(int)u.ux,(int)u.uy), bVar9 == '\0'))
  goto LAB_0018ff1f;
  if (((u.uprops[0x27].extrinsic != 0) &&
      (bVar9 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar9 == '\0')) ||
     (uVar1 = (youmonst.data)->mflags1, (uVar1 & 0x10) != 0)) goto LAB_0018ff08;
  if (((uVar1 & 1) == 0) && (u.uprops[0x3c].extrinsic == 0)) {
    bVar2 = true;
    if ((u.usteed != (monst *)0x0) && (bVar3 = false, ((u.usteed)->data->mflags1 & 1) != 0)) {
      bVar7 = false;
      bVar5 = false;
      if (u.uprops[0x31].intrinsic != 0) goto LAB_0018ff40;
LAB_0018ff23:
      bVar2 = true;
      bVar3 = false;
      bVar7 = false;
      bVar5 = false;
      if ((uVar1 & 0x400) == 0 && u.uprops[0x31].extrinsic == 0) goto LAB_0019013e;
      goto LAB_0018ff40;
    }
  }
  else if (u.uprops[0x31].intrinsic == 0) goto LAB_0018ff23;
LAB_0018ff1f:
  bVar3 = false;
  bVar2 = true;
  bVar7 = false;
  bVar5 = false;
LAB_0018ff40:
  do {
    if ((iVar11 == 0) && ((int)(youmonst.data)->mflags1 < 0)) {
      trap = t_at(level,(int)u.ux,(int)u.uy);
      bVar4 = true;
      bVar6 = bVar5;
      bVar8 = bVar7;
      if (trap != (trap *)0x0) {
        bVar17 = (trap->field_0x8 & 0x3f) == 0x25;
        bVar6 = true;
        if (!bVar17) {
          bVar6 = bVar7;
        }
        bVar8 = bVar6;
        if ((bool)(bVar17 & bVar3)) {
          pcVar16 = "holding you";
          if (u.utraptype != 0) {
            pcVar16 = "armed";
          }
          if (u.utrap == 0) {
            pcVar16 = "armed";
          }
          sprintf(local_138,"There is a bear trap here (%s); eat it?",pcVar16);
          cVar10 = yn_function(local_138,"ynq",'n');
          if (cVar10 == 'q') {
            bVar4 = false;
            local_148 = (obj *)0x0;
            bVar6 = bVar5;
            bVar8 = bVar7;
          }
          else {
            bVar4 = true;
            bVar6 = bVar5;
            bVar8 = bVar7;
            if (cVar10 == 'y') {
              u.utrap = 0;
              u.utraptype = 0;
              deltrap(level,trap);
              local_148 = mksobj(level,0xf9,'\x01','\0');
              bVar4 = false;
            }
          }
        }
      }
      bVar7 = bVar8;
      bVar5 = bVar6;
      if (!bVar4) {
        return local_148;
      }
    }
    if (bVar3) {
      cVar10 = highc(*verb);
      unaff_R13 = (you *)0x0;
      sprintf(local_b8,"%c%s what?",(ulong)(uint)(int)cVar10,verb + 1);
      iVar13 = query_objlist(local_b8,level->objects[u.ux][u.uy],9,&local_140,1,allow);
      if (iVar13 != 0) {
        unaff_R13 = (you *)local_140->obj;
        free(local_140);
      }
    }
    else {
      for (unaff_R13 = (you *)level->objects[u.ux][u.uy]; unaff_R13 != (you *)0x0;
          unaff_R13 = *(you **)&unaff_R13->uz) {
        bVar9 = (*allow)((obj *)unaff_R13);
        if (bVar9 != '\0') {
          bVar7 = true;
          bVar5 = true;
          goto LAB_0019013e;
        }
      }
      unaff_R13 = (you *)0x0;
    }
LAB_0019013e:
    if (!bVar2) break;
    if (iVar12 == 0) {
      pcVar15 = "\x05\a";
      pcVar16 = "\x15\x16\x05\a";
    }
    else if (iVar11 == 0) {
      pcVar15 = "\f\x02\x03\b\t\v\x04\x05\a\x06\r\x0e\x0f\x10\n";
      pcVar16 = "\x15\x16\f\x02\x03\b\t\v\x04\x05\a\x06\r\x0e\x0f\x10\n";
    }
    else {
      pcVar15 = "\a";
      pcVar16 = "\x15\x16\a";
    }
    if (!bVar5) {
      pcVar16 = pcVar15;
    }
    bVar2 = false;
    unaff_R13 = (you *)getobj(pcVar16,verb,(obj **)0x0);
    bVar3 = true;
  } while (unaff_R13 == (you *)&zeroobj);
  if ((unaff_R13 != (you *)0x0) && (bVar9 = (*allow)((obj *)unaff_R13), bVar9 == '\0')) {
    unaff_R13 = (you *)0x0;
    pline("You can\'t %s that!",verb);
  }
  return (obj *)unaff_R13;
}

Assistant:

struct obj *floorfood(const char *verb)
{
	struct obj *otmp;
	char qbuf[QBUFSZ];
	char c;
	boolean feeding = (!strcmp(verb, "eat"));
	boolean sacrificing = (!strcmp(verb, "sacrifice"));
	boolean tinning = (!strcmp(verb, "tin"));
	boolean can_floorfood = FALSE;
	boolean checking_can_floorfood = TRUE;
	boolean (*floorfood_check)(const struct obj *);

	if (!verb || !*verb)
	    impossible("floorfood: no verb given");

	floorfood_check = (sacrificing ? can_sacrifice :
			   tinning ? tinnable :
			   feeding ? is_edible : other_floorfood);

	/* if we can't touch floor objects then use invent food only */
	if (!can_reach_floor() ||
		(feeding && u.usteed) || /* can't eat off floor while riding */
		((is_pool(level, u.ux, u.uy) || is_lava(level, u.ux, u.uy)) &&
		    (Wwalking || is_clinger(youmonst.data) ||
			(Flying && !Breathless))))
	    goto skipfloor;

    eat_floorfood:
	/* Two passes:
	 *
	 * 1) Check if anything on the floor can be chosen and make it available
	 *    from the object picking prompt.
	 * 2) If the floor was chosen (,) from that prompt, go through again,
	 *    this time asking for the specific floor option.
	 */

	if (feeding && metallivorous(youmonst.data)) {
	    struct trap *ttmp = t_at(level, u.ux, u.uy);

	    if (ttmp && ttmp->tseen && ttmp->ttyp == BEAR_TRAP) {
		if (checking_can_floorfood) {
		    can_floorfood = TRUE;
		} else {
		    /* If not already stuck in the trap, perhaps there should
		       be a chance to becoming trapped?  Probably not, because
		       then the trap would just get eaten on the _next_ turn... */
		    sprintf(qbuf, "There is a bear trap here (%s); eat it?",
			    (u.utrap && u.utraptype == TT_BEARTRAP) ?
			    "holding you" : "armed");
		    if ((c = yn_function(qbuf, ynqchars, 'n')) == 'y') {
			u.utrap = u.utraptype = 0;
			deltrap(level, ttmp);
			return mksobj(level, BEARTRAP, TRUE, FALSE);
		    } else if (c == 'q') {
			return NULL;
		    }
		}
	    }
	}

	if (checking_can_floorfood) {
	    for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp->nexthere) {
		if ((*floorfood_check)(otmp)) {
		    can_floorfood = TRUE;
		    break;
		}
	    }
	} else {
	    struct object_pick *floorfood_list;
	    char qbuf[QBUFSZ];
	    int n;
	    sprintf(qbuf, "%c%s what?", highc(*verb), verb + 1);
	    n = query_objlist(qbuf, level->objects[u.ux][u.uy],
			      BY_NEXTHERE|INVORDER_SORT, &floorfood_list,
			      PICK_ONE, floorfood_check);
	    if (n) {
		otmp = floorfood_list[0].obj;
		free(floorfood_list);
	    } else {
		otmp = NULL;
	    }
	}

    skipfloor:
	if (checking_can_floorfood) {
	    /* We cannot use ALL_CLASSES since that causes getobj() to skip its
	     * "ugly checks" and we need to check for inedible items.
	     */
	    otmp = getobj(
		    sacrificing ?
			(can_floorfood ? sacrifice_types_ground : sacrifice_types) :
		    feeding ?
			(can_floorfood ? allobj_ground : allobj) :
			(can_floorfood ? comestibles_ground : comestibles),
		    verb, NULL);
	    if (otmp == &zeroobj) {
		checking_can_floorfood = FALSE;
		goto eat_floorfood;
	    }
	}

	if (otmp && !(*floorfood_check)(otmp)) {
	    pline("You can't %s that!", verb);
	    return NULL;
	}
	return otmp;
}